

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionEuler::ComputeInertialForce
          (ChBeamSectionEuler *this,ChVector<double> *mFi,ChVector<double> *mTi,
          ChVector<double> *mWvel,ChVector<double> *mWacc,ChVector<double> *mXacc)

{
  double *pdVar1;
  double *pdVar2;
  undefined8 uVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  uint uVar7;
  double *pdVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  double dVar14;
  undefined1 auVar13 [16];
  ChVectorN<double,_6> xpp;
  ChVectorN<double,_6> Fipp;
  ChVector<double> mT_quadratic;
  ChVector<double> mF_quadratic;
  ChMatrixNM<double,_6,_6> Mi;
  double local_270;
  double dStack_268;
  double local_260;
  double dStack_258;
  double local_250;
  double dStack_248;
  ChVector<double> local_240;
  undefined8 local_220 [3];
  undefined1 local_208 [24];
  double local_1f0;
  double dStack_1e8;
  double local_1e0;
  double local_1d0;
  double dStack_1c8;
  double local_1c0;
  undefined8 *local_1b8;
  undefined8 local_1b0;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 local_188;
  undefined1 local_180 [32];
  double local_160 [38];
  
  (*(this->super_ChBeamSection)._vptr_ChBeamSection[0xd])(this,local_180);
  uVar7 = -((uint)((ulong)&local_270 >> 3) & 0x1fffffff) & 6;
  uVar10 = 3;
  if (uVar7 < 3) {
    uVar10 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(&local_270,mXacc,(ulong)(uVar10 * 8));
  }
  if (uVar10 != 3) {
    uVar11 = (ulong)(uVar10 << 3);
    memcpy((void *)((long)&local_270 + uVar11),(void *)((long)mXacc->m_data + uVar11),0x18 - uVar11)
    ;
  }
  uVar7 = -((uint)((ulong)&dStack_258 >> 3) & 0x1fffffff) & 7;
  uVar10 = 3;
  if (uVar7 < 3) {
    uVar10 = uVar7;
  }
  uVar11 = (ulong)(uVar10 << 3);
  memcpy(&dStack_258,mWacc,uVar11);
  if (uVar7 < 3) {
    memcpy((void *)((long)&dStack_258 + uVar11),(void *)((long)mWacc->m_data + uVar11),0x18 - uVar11
          );
  }
  pdVar8 = local_160;
  lVar9 = 0;
  do {
    pdVar1 = pdVar8 + -2;
    pdVar4 = pdVar8 + -1;
    dVar12 = *pdVar8;
    pdVar5 = pdVar8 + 1;
    pdVar2 = pdVar8 + -4;
    pdVar6 = pdVar8 + -3;
    pdVar8 = pdVar8 + 6;
    dVar12 = local_270 * *pdVar2 + local_260 * *pdVar1 + local_250 * dVar12;
    dVar14 = dStack_268 * *pdVar6 + dStack_258 * *pdVar4 + dStack_248 * *pdVar5;
    auVar13._0_8_ = dVar12 + dVar14;
    auVar13._8_8_ = dVar12 + dVar14;
    uVar3 = vmovlpd_avx(auVar13);
    local_220[lVar9] = uVar3;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  local_1d0 = 0.0;
  dStack_1c8 = 0.0;
  local_1c0 = 0.0;
  local_1e0 = 0.0;
  local_1f0 = 0.0;
  dStack_1e8 = 0.0;
  (*(this->super_ChBeamSection)._vptr_ChBeamSection[0x10])(this,&local_1d0,&local_1f0,mWvel);
  local_1b8 = local_220;
  local_1b0 = 3;
  local_198 = 0;
  local_188 = 6;
  local_1a0 = local_1b8;
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (&local_240,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
             &local_1b8,(type *)0x0);
  local_1b8 = (undefined8 *)local_208;
  local_1a0 = local_220;
  mFi->m_data[0] = local_240.m_data[0] + local_1d0;
  mFi->m_data[1] = local_240.m_data[1] + dStack_1c8;
  mFi->m_data[2] = local_240.m_data[2] + local_1c0;
  local_1b0 = 3;
  local_198 = 3;
  local_188 = 6;
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (&local_240,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
             &local_1b8,(type *)0x0);
  mTi->m_data[0] = local_240.m_data[0] + local_1f0;
  mTi->m_data[1] = local_240.m_data[1] + dStack_1e8;
  mTi->m_data[2] = local_240.m_data[2] + local_1e0;
  return;
}

Assistant:

void ChBeamSectionEuler::ComputeInertialForce(
                                    ChVector<>& mFi,          ///< total inertial force returned here
                                    ChVector<>& mTi,          ///< total inertial torque returned here
                                    const ChVector<>& mWvel,  ///< current angular velocity of section, in material frame
                                    const ChVector<>& mWacc,  ///< current angular acceleration of section, in material frame
                                    const ChVector<>& mXacc   ///< current acceleration of section, in material frame (not absolute!)
	) {
		// Default implementation as Fi = [Mi]*{xacc,wacc}+{mF_quadratic,mT_quadratic}
		// but if possible implement it in children classes with ad-hoc faster formulas.
		ChMatrixNM<double, 6, 6> Mi;
		this->ComputeInertiaMatrix(Mi);
		ChVectorN<double, 6> xpp; 
		xpp.segment(0 , 3) = mXacc.eigen();
		xpp.segment(3 , 3) = mWacc.eigen();
		ChVectorN<double, 6> Fipp = Mi * xpp;    // [Mi]*{xacc,wacc}
		ChVector<> mF_quadratic;
		ChVector<> mT_quadratic;
		this->ComputeQuadraticTerms(mF_quadratic, mT_quadratic, mWvel);  // {mF_quadratic,mT_quadratic}
		mFi = ChVector<>(Fipp.segment(0, 3)) + mF_quadratic; 
		mTi = ChVector<>(Fipp.segment(3, 3)) + mT_quadratic;
	}